

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

void LogConnectFailure<std::__cxx11::string,std::__cxx11::string>
               (bool manual_connection,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  long lVar1;
  bool bVar2;
  undefined7 in_register_00000039;
  int source_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  Level level;
  LogFlags flag;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  string error_message;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&error_message,(tinyformat *)fmt,(char *)args,args_1,in_R8);
  if ((int)CONCAT71(in_register_00000039,manual_connection) == 0) {
    flag = NET;
    level = Debug;
    bVar2 = LogAcceptCategory(NET,Debug);
    source_line = 0x235;
    if (!bVar2) goto LAB_0059cec7;
  }
  else {
    level = Info;
    flag = ALL;
    source_line = 0x233;
  }
  logging_function._M_str = "LogConnectFailure";
  logging_function._M_len = 0x11;
  source_file._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
  source_file._M_len = 0x54;
  LogPrintf_<std::__cxx11::string>
            (logging_function,source_file,source_line,flag,level,"%s\n",&error_message);
LAB_0059cec7:
  std::__cxx11::string::~string((string *)&error_message);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void LogConnectFailure(bool manual_connection, const char* fmt, const Args&... args) {
    std::string error_message = tfm::format(fmt, args...);
    if (manual_connection) {
        LogPrintf("%s\n", error_message);
    } else {
        LogDebug(BCLog::NET, "%s\n", error_message);
    }
}